

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_rownumber_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowRowNumberExecutor::EvaluateInternal
          (WindowRowNumberExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  reference pvVar4;
  pointer this_00;
  idx_t iVar5;
  idx_t iVar6;
  WindowExecutorLocalState *this_01;
  
  pdVar1 = result->data;
  this_01 = lstate + 2;
  if (gstate[1].super_WindowExecutorState._vptr_WindowExecutorState == (_func_int **)0x0) {
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,0);
    if (count != 0) {
      pdVar2 = pvVar4->data;
      iVar6 = 0;
      do {
        *(idx_t *)(pdVar1 + iVar6 * 8) = (iVar6 + row_idx + 1) - *(long *)(pdVar2 + iVar6 * 8);
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  else {
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,6);
    pdVar2 = pvVar4->data;
    pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)this_01,7);
    if (count != 0) {
      pdVar3 = pvVar4->data;
      iVar6 = 0;
      do {
        this_00 = unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                  ::operator->((unique_ptr<duckdb::WindowTokenTree,_std::default_delete<duckdb::WindowTokenTree>,_true>
                                *)(gstate + 1));
        iVar5 = WindowTokenTree::Rank
                          (this_00,*(idx_t *)(pdVar2 + iVar6 * 8),*(idx_t *)(pdVar3 + iVar6 * 8),
                           row_idx + iVar6);
        *(idx_t *)(pdVar1 + iVar6 * 8) = iVar5;
        iVar6 = iVar6 + 1;
      } while (count != iVar6);
    }
  }
  return;
}

Assistant:

void WindowRowNumberExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &grstate = gstate.Cast<WindowRowNumberGlobalState>();
	auto &lrstate = lstate.Cast<WindowRowNumberLocalState>();
	auto rdata = FlatVector::GetData<uint64_t>(result);

	if (grstate.token_tree) {
		auto frame_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_BEGIN]);
		auto frame_end = FlatVector::GetData<const idx_t>(lrstate.bounds.data[FRAME_END]);
		for (idx_t i = 0; i < count; ++i, ++row_idx) {
			// Row numbers are unique ranks
			rdata[i] = grstate.token_tree->Rank(frame_begin[i], frame_end[i], row_idx);
		}
		return;
	}

	auto partition_begin = FlatVector::GetData<const idx_t>(lrstate.bounds.data[PARTITION_BEGIN]);
	for (idx_t i = 0; i < count; ++i, ++row_idx) {
		rdata[i] = row_idx - partition_begin[i] + 1;
	}
}